

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::RunCMakeAndTest(cmCTest *this,string *output)

{
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var1;
  int iVar2;
  ostream *poVar3;
  ostringstream cmCTestLog_msg;
  char *local_1b8 [4];
  ostringstream local_198 [376];
  
  _Var1._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  (_Var1._M_head_impl)->Verbose = true;
  iVar2 = (**(code **)(*(long *)&((_Var1._M_head_impl)->BuildAndTestHandler).
                                 super_cmCTestGenericHandler + 8))
                    (&(_Var1._M_head_impl)->BuildAndTestHandler);
  cmCTestBuildAndTestHandler::GetOutput(&(_Var1._M_head_impl)->BuildAndTestHandler);
  std::__cxx11::string::assign((char *)output);
  cmDynamicLoader::FlushCache();
  if (iVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"build and test failing returning: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0xb79,local_1b8[0],false);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return iVar2;
}

Assistant:

int cmCTest::RunCMakeAndTest(std::string* output)
{
  this->Impl->Verbose = true;
  cmCTestBuildAndTestHandler* handler = this->GetBuildAndTestHandler();
  int retv = handler->ProcessHandler();
  *output = handler->GetOutput();
#ifndef CMAKE_BOOTSTRAP
  cmDynamicLoader::FlushCache();
#endif
  if (retv != 0) {
    cmCTestLog(this, DEBUG,
               "build and test failing returning: " << retv << std::endl);
  }
  return retv;
}